

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O3

void uhash_removeAll_63(UHashtable *hash)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (hash->count == 0) {
    return;
  }
  lVar3 = -1;
  do {
    lVar3 = (long)(int)lVar3;
    lVar1 = lVar3 * 0x18;
    do {
      lVar2 = lVar1;
      lVar3 = lVar3 + 1;
      if (hash->length <= lVar3) {
        return;
      }
      lVar1 = lVar2 + 0x18;
    } while (*(int *)((long)&hash->elements[1].hashcode + lVar2) < 0);
    uhash_removeElement_63(hash,(UHashElement *)((long)&hash->elements[1].hashcode + lVar2));
  } while( true );
}

Assistant:

U_CAPI void U_EXPORT2
uhash_removeAll(UHashtable *hash) {
    int32_t pos = UHASH_FIRST;
    const UHashElement *e;
    U_ASSERT(hash != NULL);
    if (hash->count != 0) {
        while ((e = uhash_nextElement(hash, &pos)) != NULL) {
            uhash_removeElement(hash, e);
        }
    }
    U_ASSERT(hash->count == 0);
}